

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

void cilk_fiber_tbb_interop_save_stack_op_info(__cilk_tbb_stack_op_thunk o)

{
  void *in_RSI;
  __cilk_tbb_stack_op_thunk *in_RDI;
  __cilk_tbb_stack_op_thunk *saved_thunk;
  __cilk_tbb_stack_op_thunk *local_18;
  
  local_18 = __cilkrts_get_tls_tbb_interop();
  if (local_18 == (__cilk_tbb_stack_op_thunk *)0x0) {
    local_18 = (__cilk_tbb_stack_op_thunk *)__cilkrts_malloc(0x1099a9);
    __cilkrts_set_tls_tbb_interop(in_RDI);
  }
  local_18->routine = (__cilk_tbb_pfn_stack_op)in_RDI;
  local_18->data = in_RSI;
  return;
}

Assistant:

void cilk_fiber_tbb_interop_save_stack_op_info(__cilk_tbb_stack_op_thunk o)
{
    __cilk_tbb_stack_op_thunk *saved_thunk =
        __cilkrts_get_tls_tbb_interop();

    DBG_STACK_OPS("Calling save_stack_op; o.routine=%p, o.data=%p, saved_thunk=%p\n",
                  o.routine, o.data, saved_thunk);

    // If there is not already space allocated, allocate some.
    if (NULL == saved_thunk) {
        saved_thunk = (__cilk_tbb_stack_op_thunk*)
            __cilkrts_malloc(sizeof(__cilk_tbb_stack_op_thunk));
        __cilkrts_set_tls_tbb_interop(saved_thunk);
    }

    *saved_thunk = o;

    DBG_STACK_OPS ("Unbound Thread %04x: tbb_interop_save_stack_op_info - saved info\n",
                   cilkos_get_current_thread_id());
}